

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema.hpp
# Opt level: O3

string * __thiscall
nlohmann::json_uri::fragment_abi_cxx11_(string *__return_storage_ptr__,json_uri *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)&this->identifier_);
  if (iVar2 == 0) {
    json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(__return_storage_ptr__,&this->pointer_);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->identifier_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->identifier_)._M_string_length
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fragment() const
	{
		if (identifier_ == "")
			return pointer_.to_string();
		else
			return identifier_;
	}